

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

bool __thiscall ON_OutlineFigure::Internal_HasValidEnds(ON_OutlineFigure *this,bool bLogErrors)

{
  bool bVar1;
  long lVar2;
  ON_OutlineFigurePoint *this_00;
  
  if (((uint)(this->m_points).m_count < 2) ||
     (bVar1 = ON_OutlineFigurePoint::IsBeginFigurePoint((this->m_points).m_a), !bVar1)) {
    if (!bLogErrors) {
      return false;
    }
  }
  else {
    lVar2 = (long)(this->m_points).m_count;
    this_00 = (ON_OutlineFigurePoint *)0x0;
    if (0 < lVar2) {
      this_00 = (this->m_points).m_a + lVar2 + -1;
    }
    bVar1 = ON_OutlineFigurePoint::IsEndFigurePoint(this_00);
    if (!bLogErrors || bVar1) {
      return bVar1;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
             ,0x1e4,"","Invalid figure start or end information.");
  return false;
}

Assistant:

bool ON_OutlineFigure::Internal_HasValidEnds(
  bool bLogErrors
) const
{
  if (m_points.UnsignedCount() >= 2
    && m_points[0].IsBeginFigurePoint()
    && m_points.Last()->IsEndFigurePoint()
    )
    return true;
  if (bLogErrors)
  {
    ON_ERROR("Invalid figure start or end information.");
  }
  return false;
}